

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O1

bool __thiscall wasm::SortedVector::erase(SortedVector *this,Index x)

{
  uint *puVar1;
  uint *puVar2;
  uint *__dest;
  bool bVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar2 - (long)puVar1 >> 2;
  while (__dest = puVar1, 0 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    uVar5 = ~uVar4 + uVar5;
    puVar1 = __dest + uVar4 + 1;
    if (x <= __dest[uVar4]) {
      puVar1 = __dest;
      uVar5 = uVar4;
    }
  }
  if ((__dest == puVar2) || (*__dest != x)) {
    bVar3 = false;
  }
  else {
    __n = (long)puVar2 - (long)(__dest + 1);
    if (__n != 0) {
      memmove(__dest,__dest + 1,__n);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               ((long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) - 1);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool erase(Index x) {
    auto it = std::lower_bound(begin(), end(), x);
    if (it != end() && *it == x) {
      std::move(it + 1, end(), it);
      resize(size() - 1);
      return true;
    }
    return false;
  }